

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.cpp
# Opt level: O3

bool __thiscall nite::Color::cInterp(Color *this,Color *f,float Step)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  fVar1 = this->r;
  fVar5 = f->r;
  if ((fVar1 != fVar5) || (NAN(fVar1) || NAN(fVar5))) {
    fVar3 = f->g;
  }
  else {
    fVar3 = f->g;
    if ((this->g == fVar3) && (!NAN(this->g) && !NAN(fVar3))) {
      if ((this->b == f->b) && (!NAN(this->b) && !NAN(f->b))) {
        if ((this->a == f->a) && (!NAN(this->a) && !NAN(f->a))) {
          return true;
        }
      }
    }
  }
  fVar2 = 1.0;
  if ((fVar5 <= 1.0) && (fVar2 = fVar5, fVar5 < 0.0)) {
    fVar2 = 0.0;
  }
  fVar5 = f->b;
  fVar6 = 1.0;
  if ((fVar3 <= 1.0) && (fVar6 = fVar3, fVar3 < 0.0)) {
    fVar6 = 0.0;
  }
  fVar3 = f->a;
  fVar4 = 1.0;
  if ((fVar5 <= 1.0) && (fVar4 = fVar5, fVar5 < 0.0)) {
    fVar4 = 0.0;
  }
  fVar5 = 1.0;
  if ((fVar3 <= 1.0) && (fVar5 = fVar3, fVar3 < 0.0)) {
    fVar5 = 0.0;
  }
  this->r = fVar1 * 100.0;
  this->g = this->g * 100.0;
  this->b = this->b * 100.0;
  this->a = this->a * 100.0;
  nite::cInterp(&this->r,fVar2 * 100.0,Step);
  nite::cInterp(&this->g,fVar6 * 100.0,Step);
  nite::cInterp(&this->b,fVar4 * 100.0,Step);
  nite::cInterp(&this->a,fVar5 * 100.0,Step);
  this->r = this->r / 100.0;
  this->g = this->g / 100.0;
  this->b = this->b / 100.0;
  this->a = this->a / 100.0;
  rectify(this);
  return false;
}

Assistant:

bool nite::Color::cInterp(const Color &f, float Step){
	if(*this == f) return true;
	auto copy = f;
	copy.to100();
	this->to100();
	nite::cInterp(r, copy.r, Step);
	nite::cInterp(g, copy.g, Step);
	nite::cInterp(b, copy.b, Step);
	nite::cInterp(a, copy.a, Step);
	this->to1();	
	rectify();
	return false;
}